

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choice.c
# Opt level: O3

void choice_add(t_choice *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  long lVar2;
  t_elem_conflict *ptVar3;
  long lVar4;
  t_float tVar5;
  double dVar6;
  float fVar7;
  
  iVar1 = x->x_n;
  lVar2 = (long)iVar1;
  ptVar3 = (t_elem_conflict *)resizebytes(x->x_vec,lVar2 * 0x2c,lVar2 * 0x2c + 0x2c);
  x->x_vec = ptVar3;
  x->x_n = iVar1 + 1;
  ptVar3[lVar2].e_age = 2.0;
  fVar7 = 0.0;
  lVar4 = 0;
  do {
    tVar5 = atom_getfloatarg((int)lVar4,argc,argv);
    ptVar3[lVar2].e_weight[lVar4] = tVar5;
    fVar7 = fVar7 + tVar5 * tVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  if (fVar7 <= 0.0) {
    fVar7 = 1.0;
  }
  else {
    dVar6 = (double)fVar7;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    fVar7 = (float)(1.0 / dVar6);
  }
  lVar4 = 1;
  do {
    ptVar3[lVar2].e_weight[lVar4 + -1] = ptVar3[lVar2].e_weight[lVar4 + -1] * fVar7;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb);
  return;
}

Assistant:

static void choice_add(t_choice *x, t_symbol *s, int argc, t_atom *argv)
{
    int oldn = x->x_n, newn = oldn + 1, i;
    t_elem *e;
    t_float sum, normal;
    x->x_vec = (t_elem *)resizebytes(x->x_vec, oldn * sizeof(t_elem),
        newn * sizeof(t_elem));
    x->x_n = newn;
    e = x->x_vec + oldn;
    e->e_age = 2;
    
    for (i = 0, sum = 0; i < DIMENSION; i++)
    {
        t_float f = atom_getfloatarg(i, argc, argv);
        e->e_weight[i] = f;
        sum += f*f;
    }
    normal = (t_float)(sum > 0 ? 1./sqrt(sum) : 1);
    for (i = 0; i < DIMENSION; i++)
        e->e_weight[i] *= normal;
}